

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

void __thiscall pstore::file::file_handle::unlock(file_handle *this,uint64_t offset,size_t size)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(size | offset) < 0) {
    raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"lock");
  }
  ensure_open(this);
  iVar1 = lock_reg(this->file_,6,2,offset,0,size);
  if (iVar1 == 0) {
    return;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::string::string((string *)&local_40,(string *)&this->path_);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"fcntl/unlock failed",&local_40);
}

Assistant:

void file_handle::unlock (std::uint64_t const offset, std::size_t const size) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();
            if (file_handle::lock_reg (file_, F_SETLK,
                                       F_UNLCK, // release an existing lock
                                       static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                raise_file_error (err, "fcntl/unlock failed", this->path ());
            }
        }